

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scrollbar.cxx
# Opt level: O0

void __thiscall Fl_Scrollbar::increment_cb(Fl_Scrollbar *this)

{
  bool bVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  int local_34;
  int local_1c;
  int i;
  int ls;
  char inv;
  Fl_Scrollbar *this_local;
  
  dVar5 = Fl_Valuator::maximum((Fl_Valuator *)this);
  dVar6 = Fl_Valuator::minimum((Fl_Valuator *)this);
  bVar1 = dVar6 <= dVar5;
  if (bVar1) {
    local_34 = *(int *)&(this->super_Fl_Slider).field_0xac;
  }
  else {
    local_34 = -*(int *)&(this->super_Fl_Slider).field_0xac;
  }
  iVar2 = this->pushed_;
  if (iVar2 == 1) {
    local_1c = -local_34;
  }
  else if (iVar2 == 5) {
    dVar5 = Fl_Valuator::maximum((Fl_Valuator *)this);
    dVar6 = Fl_Valuator::minimum((Fl_Valuator *)this);
    fVar3 = Fl_Slider::slider_size(&this->super_Fl_Slider);
    fVar4 = Fl_Slider::slider_size(&this->super_Fl_Slider);
    local_1c = -(int)(((dVar5 - dVar6) * (double)fVar3) / (1.0 - (double)fVar4));
    if (bVar1) {
      if (-local_34 < local_1c) {
        local_1c = -local_34;
      }
    }
    else if (local_1c < -local_34) {
      local_1c = -local_34;
    }
  }
  else if (iVar2 == 6) {
    dVar5 = Fl_Valuator::maximum((Fl_Valuator *)this);
    dVar6 = Fl_Valuator::minimum((Fl_Valuator *)this);
    fVar3 = Fl_Slider::slider_size(&this->super_Fl_Slider);
    fVar4 = Fl_Slider::slider_size(&this->super_Fl_Slider);
    local_1c = (int)(((dVar5 - dVar6) * (double)fVar3) / (1.0 - (double)fVar4));
    if (bVar1) {
      if (local_1c < local_34) {
        local_1c = local_34;
      }
    }
    else if (local_34 < local_1c) {
      local_1c = local_34;
    }
  }
  else {
    local_1c = local_34;
  }
  iVar2 = value(this);
  dVar5 = Fl_Valuator::clamp((Fl_Valuator *)this,(double)(iVar2 + local_1c));
  Fl_Valuator::handle_drag((Fl_Valuator *)this,dVar5);
  return;
}

Assistant:

void Fl_Scrollbar::increment_cb() {
  char inv = maximum()<minimum();
  int ls = inv ? -linesize_ : linesize_;
  int i;
  switch (pushed_) {
    case 1: // clicked on arrow left
      i = -ls;
      break;
    default: // clicked on arrow right
      i =  ls;
      break;
    case 5: // clicked into the box next to the slider on the left
      i = -(int((maximum()-minimum())*slider_size()/(1.0-slider_size())));
      if (inv) {
        if (i<-ls) i = -ls;
      } else {
        if (i>-ls) i = -ls; // err
      }
      break;
    case 6: // clicked into the box next to the slider on the right
      i = (int((maximum()-minimum())*slider_size()/(1.0-slider_size())));
      if (inv) {
        if (i>ls) i = ls;
      } else {
        if (i<ls) i = ls; // err
      }
      break;
  }
  handle_drag(clamp(value() + i));
}